

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

cl_int __thiscall
CLIntercept::CopyBuffer
          (CLIntercept *this,cl_command_queue commandQueue,cl_mem srcBuffer,cl_mem dstBuffer,
          size_t srcOffset,size_t dstOffset,size_t bytesToCopy,cl_uint numEventsInWaitList,
          cl_event *eventWaitList,cl_event *event)

{
  mutex *__mutex;
  int iVar1;
  cl_int cVar2;
  undefined8 uVar3;
  cl_context context;
  
  __mutex = &this->m_Mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    context = (cl_context)0x0;
    cVar2 = (*(this->m_Dispatch).clGetCommandQueueInfo)
                      (commandQueue,0x1090,8,&context,(size_t *)0x0);
    if (cVar2 == 0) {
      cVar2 = CopyBufferHelper(this,context,commandQueue,srcBuffer,dstBuffer,srcOffset,dstOffset,
                               bytesToCopy,numEventsInWaitList,eventWaitList,event);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return cVar2;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

cl_int CLIntercept::CopyBuffer(
    cl_command_queue commandQueue,
    cl_mem srcBuffer,
    cl_mem dstBuffer,
    size_t srcOffset,
    size_t dstOffset,
    size_t bytesToCopy,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    cl_context  context = NULL;

    // Get the context for this command queue.
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetCommandQueueInfo(
            commandQueue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = CopyBufferHelper(
            context,
            commandQueue,
            srcBuffer,
            dstBuffer,
            srcOffset,
            dstOffset,
            bytesToCopy,
            numEventsInWaitList,
            eventWaitList,
            event );
    }

    return errorCode;
}